

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  stbi_uc *psVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  stbi_uc *psVar14;
  ulong uVar15;
  byte *pbVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  stbi_uc *psVar28;
  byte *pbVar29;
  byte bVar30;
  long lVar31;
  uint uVar32;
  stbi_uc *psVar33;
  uint uVar34;
  long lVar35;
  bool bVar36;
  ulong local_60;
  ulong uVar24;
  
  bVar36 = depth == 0x10;
  uVar5 = x * out_n;
  uVar6 = uVar5 << bVar36;
  iVar2 = a->s->img_n;
  uVar7 = iVar2 << bVar36;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar10 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar36,0);
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar8 = iVar2 * x;
    uVar23 = iVar8 * depth + 7U >> 3;
    uVar24 = (ulong)uVar23;
    if ((uVar23 + 1) * y <= raw_len) {
      lVar11 = (long)iVar2;
      if (y != 0) {
        lVar31 = -(ulong)uVar6;
        lVar35 = (long)(out_n << bVar36);
        iVar9 = x - 1;
        lVar12 = -lVar35;
        uVar27 = 0;
        uVar15 = 0;
        local_60 = (ulong)x;
        do {
          pbVar16 = raw + 1;
          bVar3 = *raw;
          if ((ulong)bVar3 < 5) {
            psVar10 = a->out + uVar6 * (int)uVar15;
            if (depth < 8) {
              if (x < uVar23) {
                __assert_fail("img_width_bytes <= x",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                              ,0x10da,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              psVar10 = psVar10 + (uVar5 - uVar23);
              uVar7 = 1;
              local_60 = uVar24;
            }
            bVar4 = bVar3;
            if (uVar15 == 0) {
              bVar4 = ""[bVar3];
            }
            if (0 < (int)uVar7) {
              uVar25 = 0;
              do {
                switch(bVar4) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar30 = pbVar16[uVar25];
                  goto LAB_001354de;
                case 2:
                case 4:
                  bVar30 = psVar10[uVar25 + lVar31];
                  break;
                case 3:
                  bVar30 = psVar10[uVar25 + lVar31] >> 1;
                  break;
                default:
                  goto switchD_001354c4_default;
                }
                bVar30 = bVar30 + pbVar16[uVar25];
LAB_001354de:
                psVar10[uVar25] = bVar30;
switchD_001354c4_default:
                uVar25 = uVar25 + 1;
              } while (uVar7 != uVar25);
            }
            if (depth == 8) {
              lVar22 = (long)out_n;
              lVar21 = lVar11;
              if (iVar2 != out_n) {
                psVar10[lVar11] = 0xff;
              }
LAB_00135540:
              pbVar16 = pbVar16 + lVar21;
            }
            else {
              if (depth == 0x10) {
                lVar21 = (long)(int)uVar7;
                lVar22 = lVar35;
                if (iVar2 != out_n) {
                  (psVar10 + lVar21)[0] = 0xff;
                  (psVar10 + lVar21)[1] = 0xff;
                }
                goto LAB_00135540;
              }
              pbVar16 = raw + 2;
              lVar22 = 1;
            }
            psVar33 = psVar10 + lVar22;
            if (depth < 8 || iVar2 == out_n) {
              uVar13 = ((int)local_60 + -1) * uVar7;
              switch(bVar4) {
              case 0:
                memcpy(psVar33,pbVar16,(long)(int)uVar13);
                break;
              case 1:
                if (0 < (int)uVar13) {
                  uVar25 = 0;
                  do {
                    psVar33[uVar25] = psVar10[uVar25 + (lVar22 - (int)uVar7)] + pbVar16[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar13 != uVar25);
                }
                break;
              case 2:
                if (0 < (int)uVar13) {
                  uVar25 = 0;
                  do {
                    psVar33[uVar25] = psVar33[uVar25 + lVar31] + pbVar16[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar13 != uVar25);
                }
                break;
              case 3:
                if (0 < (int)uVar13) {
                  uVar25 = 0;
                  do {
                    psVar33[uVar25] =
                         (char)((uint)psVar10[uVar25 + (lVar22 - (int)uVar7)] +
                                (uint)psVar33[uVar25 + lVar31] >> 1) + pbVar16[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar13 != uVar25);
                }
                break;
              case 4:
                if (0 < (int)uVar13) {
                  pbVar29 = psVar10 + (lVar22 - (int)uVar7);
                  uVar25 = 0;
                  do {
                    bVar4 = *pbVar29;
                    bVar30 = psVar33[lVar31];
                    bVar26 = pbVar29[lVar31];
                    iVar18 = ((uint)bVar30 + (uint)bVar4) - (uint)bVar26;
                    uVar32 = iVar18 - (uint)bVar4;
                    uVar34 = -uVar32;
                    if (0 < (int)uVar32) {
                      uVar34 = uVar32;
                    }
                    uVar17 = iVar18 - (uint)bVar30;
                    uVar32 = -uVar17;
                    if (0 < (int)uVar17) {
                      uVar32 = uVar17;
                    }
                    uVar19 = iVar18 - (uint)bVar26;
                    uVar17 = -uVar19;
                    if (0 < (int)uVar19) {
                      uVar17 = uVar19;
                    }
                    if (uVar32 <= uVar17) {
                      bVar26 = bVar30;
                    }
                    if (uVar17 < uVar34) {
                      bVar4 = bVar26;
                    }
                    if (uVar32 < uVar34) {
                      bVar4 = bVar26;
                    }
                    *psVar33 = bVar4 + pbVar16[uVar25];
                    uVar25 = uVar25 + 1;
                    pbVar29 = pbVar29 + 1;
                    psVar33 = psVar33 + 1;
                  } while (uVar13 != uVar25);
                }
                break;
              case 5:
                if (0 < (int)uVar13) {
                  uVar25 = 0;
                  do {
                    psVar33[uVar25] =
                         (psVar10[uVar25 + (lVar22 - (int)uVar7)] >> 1) + pbVar16[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar13 != uVar25);
                }
                break;
              case 6:
                if (0 < (int)uVar13) {
                  uVar25 = 0;
                  do {
                    psVar33[uVar25] = psVar10[uVar25 + (lVar22 - (int)uVar7)] + pbVar16[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar13 != uVar25);
                }
              }
              pbVar16 = pbVar16 + (int)uVar13;
            }
            else {
              if (iVar2 + 1 != out_n) {
                __assert_fail("img_n+1 == out_n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                              ,0x1118,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              switch(bVar4) {
              case 0:
                if (iVar9 != 0) {
                  iVar18 = iVar9;
                  do {
                    if (0 < (int)uVar7) {
                      uVar25 = 0;
                      do {
                        psVar33[uVar25] = pbVar16[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar7 != uVar25);
                    }
                    psVar33[(int)uVar7] = 0xff;
                    pbVar16 = pbVar16 + (int)uVar7;
                    psVar33 = psVar33 + lVar35;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                break;
              case 1:
                if (iVar9 != 0) {
                  psVar10 = psVar10 + lVar22 + lVar12;
                  iVar18 = iVar9;
                  do {
                    if (0 < (int)uVar7) {
                      uVar25 = 0;
                      do {
                        psVar33[uVar25] = psVar10[uVar25] + pbVar16[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar7 != uVar25);
                    }
                    psVar33[(int)uVar7] = 0xff;
                    pbVar16 = pbVar16 + (int)uVar7;
                    psVar33 = psVar33 + lVar35;
                    psVar10 = psVar10 + lVar35;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                break;
              case 2:
                if (iVar9 != 0) {
                  iVar18 = iVar9;
                  do {
                    if (0 < (int)uVar7) {
                      uVar25 = 0;
                      do {
                        psVar33[uVar25] = psVar33[uVar25 + lVar31] + pbVar16[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar7 != uVar25);
                    }
                    psVar33[(int)uVar7] = 0xff;
                    pbVar16 = pbVar16 + (int)uVar7;
                    psVar33 = psVar33 + lVar35;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                break;
              case 3:
                if (iVar9 != 0) {
                  iVar18 = iVar9;
                  do {
                    if (0 < (int)uVar7) {
                      uVar25 = 0;
                      psVar10 = psVar33;
                      do {
                        *psVar10 = (char)((uint)psVar10[lVar12] + (uint)psVar10[lVar31] >> 1) +
                                   pbVar16[uVar25];
                        uVar25 = uVar25 + 1;
                        psVar10 = psVar10 + 1;
                      } while (uVar7 != uVar25);
                    }
                    psVar33[(int)uVar7] = 0xff;
                    pbVar16 = pbVar16 + (int)uVar7;
                    psVar33 = psVar33 + lVar35;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                break;
              case 4:
                if (iVar9 != 0) {
                  psVar14 = psVar10 + lVar22 + lVar31;
                  psVar28 = psVar10 + lVar22 + lVar12;
                  psVar10 = psVar10 + lVar22 + (lVar12 - (ulong)uVar6);
                  iVar18 = iVar9;
                  do {
                    if (0 < (int)uVar7) {
                      uVar25 = 0;
                      do {
                        bVar4 = psVar28[uVar25];
                        bVar30 = psVar14[uVar25];
                        bVar26 = psVar10[uVar25];
                        iVar20 = ((uint)bVar30 + (uint)bVar4) - (uint)bVar26;
                        uVar34 = iVar20 - (uint)bVar4;
                        uVar13 = -uVar34;
                        if (0 < (int)uVar34) {
                          uVar13 = uVar34;
                        }
                        uVar32 = iVar20 - (uint)bVar30;
                        uVar34 = -uVar32;
                        if (0 < (int)uVar32) {
                          uVar34 = uVar32;
                        }
                        uVar17 = iVar20 - (uint)bVar26;
                        uVar32 = -uVar17;
                        if (0 < (int)uVar17) {
                          uVar32 = uVar17;
                        }
                        if (uVar34 <= uVar32) {
                          bVar26 = bVar30;
                        }
                        if (uVar32 < uVar13) {
                          bVar4 = bVar26;
                        }
                        if (uVar34 < uVar13) {
                          bVar4 = bVar26;
                        }
                        psVar33[uVar25] = bVar4 + pbVar16[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar7 != uVar25);
                    }
                    psVar33[(int)uVar7] = 0xff;
                    pbVar16 = pbVar16 + (int)uVar7;
                    psVar33 = psVar33 + lVar35;
                    psVar14 = psVar14 + lVar35;
                    psVar28 = psVar28 + lVar35;
                    psVar10 = psVar10 + lVar35;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                break;
              case 5:
                if (iVar9 != 0) {
                  psVar10 = psVar10 + lVar22 + lVar12;
                  iVar18 = iVar9;
                  do {
                    if (0 < (int)uVar7) {
                      uVar25 = 0;
                      do {
                        psVar33[uVar25] = (psVar10[uVar25] >> 1) + pbVar16[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar7 != uVar25);
                    }
                    psVar33[(int)uVar7] = 0xff;
                    pbVar16 = pbVar16 + (int)uVar7;
                    psVar33 = psVar33 + lVar35;
                    psVar10 = psVar10 + lVar35;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
                break;
              case 6:
                if (iVar9 != 0) {
                  psVar10 = psVar10 + lVar22 + lVar12;
                  iVar18 = iVar9;
                  do {
                    if (0 < (int)uVar7) {
                      uVar25 = 0;
                      do {
                        psVar33[uVar25] = psVar10[uVar25] + pbVar16[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar7 != uVar25);
                    }
                    psVar33[(int)uVar7] = 0xff;
                    pbVar16 = pbVar16 + (int)uVar7;
                    psVar33 = psVar33 + lVar35;
                    psVar10 = psVar10 + lVar35;
                    iVar18 = iVar18 + -1;
                  } while (iVar18 != 0);
                }
              }
              if (x != 0 && depth == 0x10) {
                psVar10 = a->out + (long)(int)uVar7 + (ulong)uVar27 + 1;
                uVar25 = (ulong)x;
                do {
                  *psVar10 = 0xff;
                  psVar10 = psVar10 + lVar35;
                  uVar13 = (int)uVar25 - 1;
                  uVar25 = (ulong)uVar13;
                } while (uVar13 != 0);
              }
            }
          }
          else {
            stbi__g_failure_reason = "invalid filter";
          }
          if (4 < bVar3) {
            return 0;
          }
          uVar15 = uVar15 + 1;
          uVar27 = uVar27 + uVar6;
          raw = pbVar16;
        } while (uVar15 != y);
      }
      if (7 < depth) {
        if (depth != 0x10) {
          return 1;
        }
        if (uVar5 * y != 0) {
          psVar10 = a->out;
          lVar11 = 0;
          do {
            puVar1 = (ushort *)(psVar10 + lVar11 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar11 = lVar11 + 1;
          } while (uVar5 * y != (int)lVar11);
          return 1;
        }
        return 1;
      }
      if (y == 0) {
        return 1;
      }
      uVar7 = x - 1;
      lVar11 = uVar5 - uVar24;
      lVar12 = (ulong)uVar7 + 1;
      uVar23 = 0;
      uVar15 = 0;
      do {
        bVar3 = 1;
        if (color == 0) {
          bVar3 = ""[depth];
        }
        psVar10 = a->out;
        pbVar29 = psVar10 + uVar6 * (int)uVar15;
        pbVar16 = pbVar29 + (uVar5 - uVar24);
        uVar25 = (ulong)uVar23;
        if (depth == 4) {
          iVar9 = iVar8;
          if (1 < iVar8) {
            psVar33 = psVar10 + lVar11;
            iVar18 = iVar8;
            do {
              psVar10[uVar25] = (psVar33[uVar25] >> 4) * bVar3;
              psVar10[uVar25 + 1] = (psVar33[uVar25] & 0xf) * bVar3;
              iVar9 = iVar18 + -2;
              psVar33 = psVar33 + 1;
              psVar10 = psVar10 + 2;
              bVar36 = 3 < iVar18;
              iVar18 = iVar9;
            } while (bVar36);
            pbVar16 = psVar33 + uVar25;
            pbVar29 = psVar10 + uVar25;
          }
          if (iVar9 == 1) {
            bVar4 = *pbVar16 >> 4;
LAB_00135da8:
            bVar3 = bVar4 * bVar3;
LAB_00135dab:
            *pbVar29 = bVar3;
          }
        }
        else if (depth == 2) {
          iVar9 = iVar8;
          if (3 < iVar8) {
            psVar33 = psVar10 + lVar11;
            iVar18 = iVar8;
            do {
              psVar10[uVar25] = (psVar33[uVar25] >> 6) * bVar3;
              psVar10[uVar25 + 1] = (psVar33[uVar25] >> 4 & 3) * bVar3;
              psVar10[uVar25 + 2] = (psVar33[uVar25] >> 2 & 3) * bVar3;
              psVar10[uVar25 + 3] = (psVar33[uVar25] & 3) * bVar3;
              iVar9 = iVar18 + -4;
              psVar33 = psVar33 + 1;
              psVar10 = psVar10 + 4;
              bVar36 = 7 < iVar18;
              iVar18 = iVar9;
            } while (bVar36);
            pbVar16 = psVar33 + uVar25;
            pbVar29 = psVar10 + uVar25;
          }
          if (0 < iVar9) {
            *pbVar29 = (*pbVar16 >> 6) * bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (1 < iVar9) {
            *pbVar29 = (*pbVar16 >> 4 & 3) * bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (iVar9 == 3) {
            bVar4 = *pbVar16 >> 2 & 3;
            goto LAB_00135da8;
          }
        }
        else if (depth == 1) {
          iVar9 = iVar8;
          if (7 < iVar8) {
            psVar33 = psVar10 + lVar11;
            iVar18 = iVar8;
            do {
              psVar10[uVar25] = (char)psVar33[uVar25] >> 7 & bVar3;
              psVar10[uVar25 + 1] = (char)(psVar33[uVar25] * '\x02') >> 7 & bVar3;
              psVar10[uVar25 + 2] = (char)(psVar33[uVar25] << 2) >> 7 & bVar3;
              psVar10[uVar25 + 3] = (char)(psVar33[uVar25] << 3) >> 7 & bVar3;
              psVar10[uVar25 + 4] = (char)(psVar33[uVar25] << 4) >> 7 & bVar3;
              psVar10[uVar25 + 5] = (char)(psVar33[uVar25] << 5) >> 7 & bVar3;
              psVar10[uVar25 + 6] = (char)(psVar33[uVar25] << 6) >> 7 & bVar3;
              bVar4 = bVar3;
              if ((psVar33[uVar25] & 1) == 0) {
                bVar4 = 0;
              }
              psVar10[uVar25 + 7] = bVar4;
              iVar9 = iVar18 + -8;
              psVar33 = psVar33 + 1;
              psVar10 = psVar10 + 8;
              bVar36 = 0xf < iVar18;
              iVar18 = iVar9;
            } while (bVar36);
            pbVar16 = psVar33 + uVar25;
            pbVar29 = psVar10 + uVar25;
          }
          if (0 < iVar9) {
            *pbVar29 = (char)*pbVar16 >> 7 & bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (1 < iVar9) {
            *pbVar29 = (char)(*pbVar16 * '\x02') >> 7 & bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (2 < iVar9) {
            *pbVar29 = (char)(*pbVar16 << 2) >> 7 & bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (3 < iVar9) {
            *pbVar29 = (char)(*pbVar16 << 3) >> 7 & bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (4 < iVar9) {
            *pbVar29 = (char)(*pbVar16 << 4) >> 7 & bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (5 < iVar9) {
            *pbVar29 = (char)(*pbVar16 << 5) >> 7 & bVar3;
            pbVar29 = pbVar29 + 1;
          }
          if (iVar9 == 7) {
            bVar3 = (char)(*pbVar16 << 6) >> 7 & bVar3;
            goto LAB_00135dab;
          }
        }
        if (iVar2 != out_n) {
          psVar10 = a->out;
          if (iVar2 == 1) {
            lVar31 = lVar12;
            if (-1 < (int)uVar7) {
              do {
                psVar10[lVar31 * 2 + (uVar25 - 1)] = 0xff;
                psVar10[lVar31 * 2 + (uVar25 - 2)] = psVar10[lVar31 + (uVar25 - 1)];
                lVar35 = lVar31 + -1;
                bVar36 = 0 < lVar31;
                lVar31 = lVar35;
              } while (lVar35 != 0 && bVar36);
            }
          }
          else {
            if (iVar2 != 3) {
              __assert_fail("img_n == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                            ,0x1171,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            if (-1 < (int)uVar7) {
              psVar33 = psVar10 + (ulong)uVar7 * 3 + 2 + uVar25;
              lVar31 = lVar12;
              do {
                psVar10[lVar31 * 4 + (uVar25 - 1)] = 0xff;
                psVar10[lVar31 * 4 + (uVar25 - 2)] = *psVar33;
                psVar10[lVar31 * 4 + (uVar25 - 3)] = psVar33[-1];
                psVar10[lVar31 * 4 + (uVar25 - 4)] = psVar33[-2];
                psVar33 = psVar33 + -3;
                lVar35 = lVar31 + -1;
                bVar36 = 0 < lVar31;
                lVar31 = lVar35;
              } while (lVar35 != 0 && bVar36);
            }
          }
        }
        uVar15 = uVar15 + 1;
        uVar23 = uVar23 + uVar6;
        if (uVar15 == y) {
          return 1;
        }
      } while( true );
    }
    stbi__g_failure_reason = "not enough pixels";
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }